

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCallback.cpp
# Opt level: O3

bool __thiscall HighsCallback::callbackAction(HighsCallback *this,int callback_type,string *message)

{
  bool bVar1;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = false;
  if (((uint)callback_type < 10) &&
     (bVar1 = false, (this->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    if ((*(this->active).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_start.super__Bit_iterator_base._M_p >> ((ulong)(uint)callback_type & 0x3f) & 1) == 0)
    {
      bVar1 = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_40,(message->_M_dataplus)._M_p,&local_41);
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::operator()(&this->user_callback,callback_type,&local_40,&this->data_out,
                   (anon_struct_16_2_bb6a87e9 *)&this->data_in,this->user_callback_data);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      bVar1 = (this->data_in).user_interrupt != 0;
    }
  }
  return bVar1;
}

Assistant:

bool HighsCallback::callbackAction(const int callback_type,
                                   std::string message) {
  if (!callbackActive(callback_type)) return false;
  this->user_callback(callback_type, message.c_str(), &this->data_out,
                      &this->data_in, this->user_callback_data);
  // Assess any action
  bool action = this->data_in.user_interrupt;

  // Check for no action if case not handled internally
  if (callback_type == kCallbackMipImprovingSolution ||
      callback_type == kCallbackMipSolution ||
      callback_type == kCallbackMipLogging ||
      callback_type == kCallbackMipGetCutPool ||
      callback_type == kCallbackMipDefineLazyConstraints ||
      callback_type == kCallbackMipUserSolution)
    assert(!action);
  return action;
}